

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string dfile;
  
  dfile._M_dataplus._M_p = (pointer)&dfile.field_2;
  dfile._M_string_length = 0;
  dfile.field_2._M_local_buf[0] = '\0';
  if ((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) {
    cVar1 = google::protobuf::compiler::DiskSourceTree::VirtualFileToDiskFile
                      (this->tree_,filename._M_len,filename._M_str,&dfile);
    if (cVar1 == '\0') goto LAB_0014d801;
    std::operator<<(out,(string *)&dfile);
  }
  else {
LAB_0014d801:
    std::__ostream_insert<char,std::char_traits<char>>(out,filename._M_str,filename._M_len);
  }
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar3 = std::operator<<(out,"(");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,line + 1);
      poVar3 = std::operator<<(poVar3,") : ");
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,type._M_str,type._M_len);
      pcVar4 = " in column=";
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_0014d8a8;
      pcVar4 = ":";
      poVar3 = std::operator<<(out,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,line + 1);
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<((ostream *)poVar3,column + 1);
  }
LAB_0014d8a8:
  __y._M_str = "warning";
  __y._M_len = 7;
  bVar2 = std::operator==(type,__y);
  pcVar4 = ": ";
  if (bVar2) {
    pcVar4 = ": warning: ";
  }
  poVar3 = std::operator<<(out,pcVar4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,message._M_str,message._M_len);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&dfile);
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
#ifndef PROTOBUF_OPENSOURCE
        // Print full path when running under MSVS
        format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
#endif  // !PROTOBUF_OPENSOURCE
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }